

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O3

void sys_doflags(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  void *__dest;
  void *__ptr;
  char **argv;
  char cVar4;
  int argc;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  void *__ptr_00;
  ulong uVar9;
  char local_418;
  char local_417 [999];
  
  if (sys_flags == (t_symbol *)0x0) {
    sys_flags = &s_;
  }
  pcVar6 = sys_flags->s_name;
  sVar2 = strlen(pcVar6);
  if (1000 < (int)sVar2) {
    pd_error((void *)0x0,"flags: %s: too long",pcVar6);
    return;
  }
  sVar2 = strlen(pcVar6);
  uVar5 = 0;
  if ((int)sVar2 < 1000) {
    memset(&local_418,0,1000);
    memcpy(&local_418,pcVar6,(long)(int)sVar2);
    if (local_418 == '\0') {
      __ptr = (void *)0x0;
    }
    else {
      uVar5 = 0;
      pcVar6 = &local_418;
      __ptr_00 = (void *)0x0;
      do {
        cVar4 = '\0';
        pcVar3 = pcVar6;
        pcVar8 = pcVar6;
        do {
          while( true ) {
            pcVar7 = pcVar3 + 1;
            if ((local_418 == '\t' || local_418 == ' ') && cVar4 == '\0') goto LAB_00176199;
            if (local_418 == '\\') {
              local_418 = *pcVar7;
              if (local_418 != '\0') {
                pcVar7 = pcVar3 + 2;
                goto LAB_0017616f;
              }
              uVar5 = 0xfffffff6;
              goto LAB_001760ba;
            }
            if (cVar4 == local_418) break;
            if (cVar4 == '\0') {
              cVar4 = local_418;
              if ((local_418 != '\"') && (local_418 != '\'')) {
                cVar4 = '\0';
                goto LAB_0017616f;
              }
            }
            else {
LAB_0017616f:
              *pcVar8 = local_418;
              pcVar8 = pcVar8 + 1;
            }
            local_418 = *pcVar7;
            pcVar3 = pcVar7;
            if (local_418 == '\0') {
              if (cVar4 != '\0') {
                uVar5 = 0xfffffff5;
                goto LAB_001760ba;
              }
              goto LAB_00176199;
            }
          }
          local_418 = *pcVar7;
          cVar4 = '\0';
          pcVar3 = pcVar7;
        } while (local_418 != '\0');
LAB_00176199:
        pcVar3 = pcVar8;
        if (pcVar7 != pcVar8) goto LAB_001761b5;
        while ((pcVar3 = pcVar7, *pcVar3 == ' ' || (*pcVar3 == '\t'))) {
          pcVar7 = pcVar3 + 1;
LAB_001761b5:
          *pcVar3 = '\0';
        }
        __dest = calloc(((long)pcVar8 - (long)pcVar6) + 1,1);
        if (__dest == (void *)0x0) {
          uVar5 = 0xffffffea;
          goto LAB_001760ba;
        }
        memcpy(__dest,pcVar6,(long)pcVar8 - (long)pcVar6);
        __ptr = realloc(__ptr_00,uVar5 * 8 + 8);
        if (__ptr == (void *)0x0) {
          free(__dest);
          uVar5 = 0xffffffe9;
          goto LAB_001760ba;
        }
        *(void **)((long)__ptr + uVar5 * 8) = __dest;
        uVar5 = uVar5 + 1;
        local_418 = *pcVar3;
        pcVar6 = pcVar3;
        __ptr_00 = __ptr;
      } while (local_418 != '\0');
    }
    argc = (int)uVar5;
    uVar9 = uVar5 & 0xffffffff;
    argv = (char **)realloc(__ptr,uVar9 * 8 + 8);
    if (argv != (char **)0x0) {
      argv[uVar9] = (char *)0x0;
      if (-1 < argc) {
        iVar1 = sys_argparse(argc,argv);
        if (iVar1 != 0) {
          pd_error((void *)0x0,"error parsing startup arguments");
        }
        if (argc != 0) {
          uVar5 = 0;
          do {
            free(argv[uVar5]);
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
        }
        free(argv);
        return;
      }
      goto LAB_001760c2;
    }
    uVar5 = 0xffffffe9;
    __ptr_00 = __ptr;
  }
  else {
    uVar5 = 0xffffffff;
    __ptr_00 = (void *)0x0;
  }
LAB_001760ba:
  free(__ptr_00);
LAB_001760c2:
  pd_error((void *)0x0,"error#%d while parsing flags",uVar5 & 0xffffffff);
  return;
}

Assistant:

void sys_doflags(void)
{
    int rcargc=0;
    const char**rcargv = NULL;
    int len;
    int rcode = 0;
    if (!sys_flags)
        sys_flags = &s_;
    len = (int)strlen(sys_flags->s_name);
    if (len > MAXPDSTRING)
    {
        pd_error(0, "flags: %s: too long", sys_flags->s_name);
        return;
    }
    rcode = string2args(sys_flags->s_name, &rcargc, &rcargv);
    if(rcode < 0) {
        pd_error(0, "error#%d while parsing flags", rcode);
        return;
    }

    if (sys_argparse(rcargc, rcargv))
        pd_error(0, "error parsing startup arguments");

    for(len=0; len<rcargc; len++)
        free((void*)rcargv[len]);
    free(rcargv);
}